

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::SharedDtor(NeuralNetworkPreprocessing *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->featurename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  if (this->_oneof_case_[0] != 0) {
    clear_preprocessor(this);
    return;
  }
  return;
}

Assistant:

void NeuralNetworkPreprocessing::SharedDtor() {
  featurename_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (has_preprocessor()) {
    clear_preprocessor();
  }
}